

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O0

void init_motion_compensation_nstep(search_site_config *cfg,int stride,int level)

{
  FULLPEL_MV FVar1;
  FULLPEL_MV *mv;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  search_site *site;
  int i;
  FULLPEL_MV search_site_mvs [13];
  int num_search_pts;
  int tan_radius;
  int num_stages;
  int radius;
  int stage_index;
  int num_search_steps;
  double local_88;
  int local_7c;
  int local_6c;
  FULLPEL_MV local_68;
  short local_64;
  undefined2 local_62;
  short local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  short local_5a;
  undefined2 local_58;
  short local_56;
  short local_54;
  short local_52;
  short local_50;
  short local_4e;
  short local_4c;
  short local_4a;
  short local_48;
  short local_46;
  short local_44;
  short local_42;
  short local_40;
  short local_3e;
  short local_3c;
  short local_3a;
  short local_38;
  short local_36;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_14 = 0;
  *(int *)(in_RDI + 0xc64) = in_ESI;
  local_1c = 1;
  local_20 = 0xf;
  if (0 < in_EDX) {
    local_20 = 0x10;
  }
  local_10 = in_EDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  for (local_18 = 0; local_18 < local_20; local_18 = local_18 + 1) {
    if ((int)((double)local_1c * 0.41) < 2) {
      local_7c = 1;
    }
    else {
      local_7c = (int)((double)local_1c * 0.41);
    }
    local_24 = local_7c;
    local_28 = 0xc;
    if ((local_1c < 6) || (0 < local_10)) {
      local_24 = local_1c;
      local_28 = 8;
    }
    local_68.row = 0;
    local_68.col = 0;
    local_60 = (short)local_1c;
    local_64 = -local_60;
    local_62 = 0;
    local_5e = 0;
    local_5c = 0;
    local_5a = -local_60;
    local_58 = 0;
    local_56 = local_60;
    local_54 = -local_60;
    local_4e = (short)local_24;
    local_52 = -local_4e;
    local_50 = local_60;
    local_4c = -local_4e;
    local_4a = local_60;
    local_48 = local_4e;
    local_46 = -local_60;
    local_44 = -local_60;
    local_42 = local_4e;
    local_40 = local_60;
    local_3e = -local_4e;
    local_3c = local_4e;
    local_3a = local_60;
    local_38 = -local_4e;
    local_36 = -local_60;
    for (local_6c = 0; local_6c <= local_28; local_6c = local_6c + 1) {
      mv = (FULLPEL_MV *)(local_8 + (long)local_18 * 0x88 + (long)local_6c * 8);
      *mv = (&local_68)[local_6c];
      FVar1 = (FULLPEL_MV)get_offset_from_fullmv(mv,local_c);
      mv[1] = FVar1;
    }
    *(int *)(local_8 + 0xbb4 + (long)local_18 * 4) = local_28;
    *(int *)(local_8 + 0xc0c + (long)local_18 * 4) = local_1c;
    local_14 = local_14 + 1;
    if (local_18 < 0xc) {
      if ((double)local_1c * 1.5 + 0.5 <= (double)(local_1c + 1)) {
        local_88 = (double)(local_1c + 1);
      }
      else {
        local_88 = (double)local_1c * 1.5 + 0.5;
      }
      local_1c = (int)local_88;
    }
  }
  *(int *)(local_8 + 0xbb0) = local_14;
  return;
}

Assistant:

static void init_motion_compensation_nstep(search_site_config *cfg, int stride,
                                           int level) {
  int num_search_steps = 0;
  int stage_index = 0;
  cfg->stride = stride;
  int radius = 1;
  const int num_stages = (level > 0) ? 16 : 15;
  for (stage_index = 0; stage_index < num_stages; ++stage_index) {
    int tan_radius = AOMMAX((int)(0.41 * radius), 1);
    int num_search_pts = 12;
    if ((radius <= 5) || (level > 0)) {
      tan_radius = radius;
      num_search_pts = 8;
    }
    const FULLPEL_MV search_site_mvs[13] = {
      { 0, 0 },
      { -radius, 0 },
      { radius, 0 },
      { 0, -radius },
      { 0, radius },
      { -radius, -tan_radius },
      { radius, tan_radius },
      { -tan_radius, radius },
      { tan_radius, -radius },
      { -radius, tan_radius },
      { radius, -tan_radius },
      { tan_radius, radius },
      { -tan_radius, -radius },
    };

    for (int i = 0; i <= num_search_pts; ++i) {
      search_site *const site = &cfg->site[stage_index][i];
      site->mv = search_site_mvs[i];
      site->offset = get_offset_from_fullmv(&site->mv, stride);
    }
    cfg->searches_per_step[stage_index] = num_search_pts;
    cfg->radius[stage_index] = radius;
    ++num_search_steps;
    if (stage_index < 12)
      radius = (int)AOMMAX((radius * 1.5 + 0.5), radius + 1);
  }
  cfg->num_search_steps = num_search_steps;
}